

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall ft::list<int,_ft::allocator<int>_>::reverse(list<int,_ft::allocator<int>_> *this)

{
  listNode<int> *plVar1;
  listNode<int> *plVar2;
  listNode<int> *plVar3;
  node *pnVar4;
  
  if (1 < this->m_size) {
    pnVar4 = this->m_head;
    plVar2 = this->m_tail;
    plVar3 = pnVar4->next;
    if (pnVar4->next != plVar2) {
      do {
        plVar2 = plVar3->prev;
        plVar1 = plVar3->next;
        plVar3->prev = plVar1;
        plVar3->next = plVar2;
        plVar2 = this->m_tail;
        plVar3 = plVar1;
      } while (plVar1 != plVar2);
      pnVar4 = this->m_head;
    }
    this->m_head = plVar2;
    this->m_tail = pnVar4;
    plVar3 = plVar2->prev;
    plVar2->prev = plVar2->next;
    plVar2->next = plVar3;
    pnVar4 = this->m_tail;
    plVar2 = pnVar4->prev;
    pnVar4->prev = pnVar4->next;
    pnVar4->next = plVar2;
  }
  return;
}

Assistant:

void reverse() {
		if (this->size() > 1) {
			for (iterator it = this->begin(); it != this->end(); --it)
				ft::swap(it.node()->prev, it.node()->next);
			ft::swap(this->m_head, this->m_tail);
			ft::swap(this->head()->prev, this->head()->next);
			ft::swap(this->tail()->prev, this->tail()->next);
		}
	}